

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void baryonyx::itm::
     init_with_bastert<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::maximize_tag>
               (bit_array *x,quadratic_cost_type<float> *c,int variables,int value_if_0)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  float fVar6;
  
  if (variables != 0) {
    uVar5 = 0;
    do {
      piVar3 = (c->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
               super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl;
      fVar6 = (c->linear_elements)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
              _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
              super__Head_base<0UL,_float_*,_false>._M_head_impl[uVar5];
      iVar1 = piVar3[uVar5];
      iVar2 = piVar3[uVar5 + 1];
      if (iVar2 != iVar1) {
        lVar4 = 0;
        do {
          fVar6 = fVar6 + (c->quadratic_elements)._M_t.
                          super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                          .
                          super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>
                          ._M_head_impl[iVar1 + lVar4].factor;
          lVar4 = lVar4 + 1;
        } while (iVar2 - iVar1 != (int)lVar4);
      }
      if ((0.0 < fVar6) || (value_if_0 != 0 && fVar6 == 0.0)) {
        bit_array_impl::set(&x->super_bit_array_impl,(int)uVar5);
      }
      else {
        bit_array_impl::unset(&x->super_bit_array_impl,(int)uVar5);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)variables);
  }
  return;
}

Assistant:

void
init_with_bastert(bit_array& x,
                  const Cost& c,
                  const int variables,
                  const int value_if_0) noexcept
{
    for (int i = 0; i != variables; ++i)
        if (init_x<Mode>(c[i], value_if_0))
            x.set(i);
        else
            x.unset(i);
}